

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *tgt)

{
  string *config;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  string *this_00;
  byte bVar4;
  string lib;
  string linkItem;
  string exe;
  
  this_00 = &lib;
  if (tgt != (cmGeneratorTarget *)0x0) {
    bVar1 = cmGeneratorTarget::IsExecutableWithExports(tgt);
    if (((!bVar1) || (this->UseImportLibrary != false)) || (this->LoaderFlag != (char *)0x0)) {
      bVar2 = cmGeneratorTarget::IsLinkable(tgt);
      if (!bVar2) goto LAB_003603c5;
      config = &this->Config;
      if ((bVar1) && (this->LoaderFlag != (char *)0x0)) {
        linkItem._M_dataplus._M_p = (pointer)&linkItem.field_2;
        linkItem._M_string_length = 0;
        linkItem.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::assign((char *)&linkItem);
        cmGeneratorTarget::GetFullPath(&exe,tgt,config,(uint)this->UseImportLibrary,true);
        std::__cxx11::string::append((string *)&linkItem);
        std::__cxx11::string::string((string *)&lib,(string *)&linkItem);
        std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
        ::emplace_back<cmComputeLinkInformation::Item>(&this->Items,(Item *)&lib);
        std::__cxx11::string::~string((string *)&lib);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Depends,&exe);
        std::__cxx11::string::~string((string *)&exe);
        this_00 = &linkItem;
      }
      else {
        TVar3 = cmGeneratorTarget::GetType(tgt);
        if (TVar3 == INTERFACE_LIBRARY) {
          linkItem._M_dataplus._M_p = (pointer)&linkItem.field_2;
          linkItem._M_string_length = 0;
          linkItem.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string((string *)&lib,(string *)&linkItem);
          std::
          vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
          emplace_back<cmComputeLinkInformation::Item>(&this->Items,(Item *)&lib);
          std::__cxx11::string::~string((string *)&lib);
          std::__cxx11::string::~string((string *)&linkItem);
          cmGeneratorTarget::GetImportedLibName(&lib,tgt,config);
          this_00 = &lib;
          if (lib._M_string_length != 0) {
            AddItem(this,&lib,(cmGeneratorTarget *)0x0);
            this_00 = &lib;
          }
        }
        else {
          bVar4 = this->UseImportLibrary;
          if (!bVar1 && (bool)bVar4 == true) {
            TVar3 = cmGeneratorTarget::GetType(tgt);
            bVar4 = TVar3 == SHARED_LIBRARY;
          }
          cmGeneratorTarget::GetFullPath(&lib,tgt,config,(uint)bVar4,true);
          if ((this->LinkDependsNoShared != true) ||
             (TVar3 = cmGeneratorTarget::GetType(tgt), TVar3 != SHARED_LIBRARY)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Depends,&lib);
          }
          AddTargetItem(this,&lib,tgt);
          AddLibraryRuntimeInfo(this,&lib,tgt);
        }
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    return;
  }
LAB_003603c5:
  bVar1 = cmsys::SystemTools::FileIsFullPath((item->_M_dataplus)._M_p);
  if (!bVar1) {
    AddUserItem(this,item,true);
    return;
  }
  bVar1 = cmsys::SystemTools::FileIsDirectory(item);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,item);
    AddFullItem(this,item);
    AddLibraryRuntimeInfo(this,item);
    return;
  }
  AddDirectoryItem(this,item);
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(std::string const& item,
                                       cmGeneratorTarget const* tgt)
{
  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !this->UseImportLibrary && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now.
      std::string linkItem;
      linkItem = this->LoaderFlag;
      cmStateEnums::ArtifactType artifact = this->UseImportLibrary
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      std::string exe = tgt->GetFullPath(config, artifact, true);
      linkItem += exe;
      this->Items.push_back(Item(linkItem, true, tgt));
      this->Depends.push_back(exe);
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.push_back(Item(std::string(), false, tgt));

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(libName, CM_NULLPTR);
      }
    } else {
      // Decide whether to use an import library.
      bool implib =
        (this->UseImportLibrary &&
         (impexe || tgt->GetType() == cmStateEnums::SHARED_LIBRARY));
      cmStateEnums::ArtifactType artifact = implib
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      std::string lib = tgt->GetFullPath(config, artifact, true);
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib);
      }

      this->AddTargetItem(lib, tgt);
      this->AddLibraryRuntimeInfo(lib, tgt);
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmSystemTools::FileIsFullPath(item.c_str())) {
      if (cmSystemTools::FileIsDirectory(item)) {
        // This is a directory.
        this->AddDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item);
        this->AddFullItem(item);
        this->AddLibraryRuntimeInfo(item);
      }
    } else {
      // This is a library or option specified by the user.
      this->AddUserItem(item, true);
    }
  }
}